

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDMMCAnalyzerSettings.cpp
# Opt level: O3

void __thiscall SDMMCAnalyzerSettings::UpdateInterfacesFromSettings(SDMMCAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mClockChannelInterface)._M_ptr);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mCommandChannelInterface)._M_ptr);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mDataChannelInterface0)._M_ptr);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mDataChannelInterface1)._M_ptr);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mDataChannelInterface2)._M_ptr);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mDataChannelInterface3)._M_ptr);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mDataChannelInterface4)._M_ptr);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mDataChannelInterface5)._M_ptr);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mDataChannelInterface6)._M_ptr);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mDataChannelInterface7)._M_ptr);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mProtocol);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mBusWidth);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mSampleEdge);
  return;
}

Assistant:

void SDMMCAnalyzerSettings::UpdateInterfacesFromSettings()
{
	mClockChannelInterface->SetChannel(mClockChannel);
	mCommandChannelInterface->SetChannel(mCommandChannel);
	mDataChannelInterface0->SetChannel(mDataChannel0);
	mDataChannelInterface1->SetChannel(mDataChannel1);
	mDataChannelInterface2->SetChannel(mDataChannel2);
	mDataChannelInterface3->SetChannel(mDataChannel3);
	mDataChannelInterface4->SetChannel(mDataChannel4);
	mDataChannelInterface5->SetChannel(mDataChannel5);
	mDataChannelInterface6->SetChannel(mDataChannel6);
	mDataChannelInterface7->SetChannel(mDataChannel7);
	mProtocolInterface->SetNumber(mProtocol);
	mBusWidthInterface->SetNumber(mBusWidth);
	mSampleEdgeInterface->SetNumber(mSampleEdge);
}